

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

shared_ptr<Buffer> __thiscall qpdf::Stream::getRawStreamData(Stream *this)

{
  bool bVar1;
  QPDFExc *this_00;
  element_type *peVar2;
  QPDF *this_01;
  qpdf_offset_t offset;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RSI;
  shared_ptr<Buffer> sVar3;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  undefined1 local_50 [8];
  Pl_Buffer buf;
  Stream *this_local;
  
  Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_50,"stream data buffer",(Pipeline *)0x0);
  bVar1 = pipeStreamData((Stream *)in_RSI,(Pipeline *)local_50,(bool *)0x0,0,qpdf_dl_none,false,
                         false);
  if (!bVar1) {
    this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
    peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RSI);
    this_01 = QPDFObject::getQPDF(peVar2);
    QPDF::getFilename_abi_cxx11_(&local_80,this_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
    peVar2 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RSI);
    offset = QPDFObject::getParsedOffset(peVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"error getting raw stream data",&local_c9);
    QPDFExc::QPDFExc(this_00,qpdf_e_unsupported,&local_80,&local_a0,offset,&local_c8);
    __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  QTC::TC("qpdf","QPDF_Stream getRawStreamData",0);
  Pl_Buffer::getBufferSharedPointer((Pl_Buffer *)this);
  Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_50);
  sVar3.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Buffer>)sVar3.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Buffer>
Stream::getRawStreamData()
{
    Pl_Buffer buf("stream data buffer");
    if (!pipeStreamData(&buf, nullptr, 0, qpdf_dl_none, false, false)) {
        throw QPDFExc(
            qpdf_e_unsupported,
            obj->getQPDF()->getFilename(),
            "",
            obj->getParsedOffset(),
            "error getting raw stream data");
    }
    QTC::TC("qpdf", "QPDF_Stream getRawStreamData");
    return buf.getBufferSharedPointer();
}